

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall prometheus::anon_unknown_0::IntegrationTest::SetUp(IntegrationTest *this)

{
  _Alloc_hider __p;
  reference pvVar1;
  vector<int,_std::allocator<int>_> ports;
  allocator local_89;
  _Vector_base<int,_std::allocator<int>_> local_88;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  detail::make_unique<prometheus::Exposer,char_const(&)[12]>
            ((detail *)&local_30,(char (*) [12])"127.0.0.1:0");
  __p._M_p = local_30._M_dataplus._M_p;
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::reset
            ((__uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> *)
             &this->exposer_,(pointer)__p._M_p);
  std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::~unique_ptr
            ((unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> *)&local_30
            );
  Exposer::GetListeningPorts
            ((vector<int,_std::allocator<int>_> *)&local_88,
             (this->exposer_)._M_t.
             super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>.
             _M_t.
             super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>
             .super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl);
  std::__cxx11::string::string((string *)&local_50,"http://127.0.0.1:",&local_89);
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)&local_88,0);
  std::__cxx11::to_string(&local_70,*pvVar1);
  std::operator+(&local_30,&local_50,&local_70);
  std::__cxx11::string::operator=((string *)&this->base_url_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void SetUp() override {
    exposer_ = detail::make_unique<Exposer>("127.0.0.1:0");
    auto ports = exposer_->GetListeningPorts();
    base_url_ = std::string("http://127.0.0.1:") + std::to_string(ports.at(0));
  }